

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.h
# Opt level: O1

void __thiscall chrono::ChPointPointShape::~ChPointPointShape(ChPointPointShape *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class ChApi ChPointPointShape : public ChLineShape {
  public:
    ChPointPointShape() = default;

    // Call UpdateLineGeometry() if updater has any pair of points.
    // (at this point, only ChLink and its derivatives are supported.)
    virtual void Update(ChPhysicsItem* updater, const ChFrame<>& coords) override;

  private:
    // Update underlying line geometry from given two endpoints.
    // This method will be called on Update() call and should be implemented by derived classes.
    virtual void UpdateLineGeometry(const ChVector<>& endpoint1, const ChVector<>& endpoint2) = 0;
}